

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTest * __thiscall cmMakefile::CreateTest(cmMakefile *this,string *testName)

{
  cmTest *this_00;
  mapped_type *ppcVar1;
  
  this_00 = GetTest(this,testName);
  if (this_00 == (cmTest *)0x0) {
    this_00 = (cmTest *)operator_new(0x88);
    cmTest::cmTest(this_00,this);
    cmTest::SetName(this_00,testName);
    ppcVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>_>
              ::operator[](&this->Tests,testName);
    *ppcVar1 = this_00;
  }
  return this_00;
}

Assistant:

cmTest* cmMakefile::CreateTest(const std::string& testName)
{
  cmTest* test = this->GetTest(testName);
  if (test) {
    return test;
  }
  test = new cmTest(this);
  test->SetName(testName);
  this->Tests[testName] = test;
  return test;
}